

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86TEST(uchar *stream,x86Reg op1,x86Reg op2)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg op2_local;
  x86Reg op1_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,op1,op2);
  puVar3 = stream + uVar2;
  *puVar3 = 0x85;
  uVar1 = encodeRegister(op1,regCode[op2]);
  puVar3[1] = uVar1;
  return ((int)puVar3 + 2) - (int)stream;
}

Assistant:

int x86TEST(unsigned char *stream, x86Reg op1, x86Reg op2)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, op1, op2);
	*stream++ = 0x85;
	*stream++ = encodeRegister(op1, regCode[op2]);

	return int(stream - start);
}